

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

int64_t eval2(C_Parser *parser,C_Node *node,char ***label)

{
  int iVar1;
  _Bool _Var2;
  ulong uVar3;
  int64_t iVar4;
  ulong uVar5;
  int64_t iVar6;
  double dVar7;
  uint local_e8;
  uint local_e4;
  bool local_da;
  bool local_d9;
  C_Parser *local_d8;
  int64_t val;
  char ***label_local;
  C_Node *node_local;
  C_Parser *parser_local;
  
  C_add_type(parser,node);
  _Var2 = C_is_flonum(node->ty);
  if (_Var2) {
    dVar7 = eval_double(parser,node);
    parser_local = (C_Parser *)(long)dVar7;
  }
  else {
    switch(node->kind) {
    case ND_ADD:
      iVar6 = eval2(parser,node->lhs,label);
      iVar4 = eval(parser,node->rhs);
      parser_local = (C_Parser *)(iVar6 + iVar4);
      break;
    case ND_SUB:
      iVar6 = eval2(parser,node->lhs,label);
      iVar4 = eval(parser,node->rhs);
      parser_local = (C_Parser *)(iVar6 - iVar4);
      break;
    case ND_MUL:
      iVar6 = eval(parser,node->lhs);
      iVar4 = eval(parser,node->rhs);
      parser_local = (C_Parser *)(iVar6 * iVar4);
      break;
    case ND_DIV:
      if ((node->ty->is_unsigned & 1U) == 0) {
        iVar6 = eval(parser,node->lhs);
        iVar4 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(iVar6 / iVar4);
      }
      else {
        uVar5 = eval(parser,node->lhs);
        uVar3 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(uVar5 / uVar3);
      }
      break;
    case ND_NEG:
      iVar6 = eval(parser,node->lhs);
      parser_local = (C_Parser *)-iVar6;
      break;
    case ND_MOD:
      if ((node->ty->is_unsigned & 1U) == 0) {
        iVar6 = eval(parser,node->lhs);
        iVar4 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(iVar6 % iVar4);
      }
      else {
        uVar5 = eval(parser,node->lhs);
        uVar3 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(uVar5 % uVar3);
      }
      break;
    case ND_BITAND:
      uVar5 = eval(parser,node->lhs);
      uVar3 = eval(parser,node->rhs);
      parser_local = (C_Parser *)(uVar5 & uVar3);
      break;
    case ND_BITOR:
      uVar5 = eval(parser,node->lhs);
      uVar3 = eval(parser,node->rhs);
      parser_local = (C_Parser *)(uVar5 | uVar3);
      break;
    case ND_BITXOR:
      uVar5 = eval(parser,node->lhs);
      uVar3 = eval(parser,node->rhs);
      parser_local = (C_Parser *)(uVar5 ^ uVar3);
      break;
    case ND_SHL:
      iVar6 = eval(parser,node->lhs);
      iVar4 = eval(parser,node->rhs);
      parser_local = (C_Parser *)(iVar6 << ((byte)iVar4 & 0x3f));
      break;
    case ND_SHR:
      if (((node->ty->is_unsigned & 1U) == 0) || (node->ty->size != 8)) {
        iVar6 = eval(parser,node->lhs);
        iVar4 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(iVar6 >> ((byte)iVar4 & 0x3f));
      }
      else {
        uVar5 = eval(parser,node->lhs);
        iVar6 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(uVar5 >> ((byte)iVar6 & 0x3f));
      }
      break;
    case ND_EQ:
      iVar6 = eval(parser,node->lhs);
      iVar4 = eval(parser,node->rhs);
      parser_local = (C_Parser *)(long)(int)(uint)(iVar6 == iVar4);
      break;
    case ND_NE:
      iVar6 = eval(parser,node->lhs);
      iVar4 = eval(parser,node->rhs);
      parser_local = (C_Parser *)(long)(int)(uint)(iVar6 != iVar4);
      break;
    case ND_LT:
      if ((node->lhs->ty->is_unsigned & 1U) == 0) {
        iVar6 = eval(parser,node->lhs);
        iVar4 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(long)(int)(uint)(iVar6 < iVar4);
      }
      else {
        uVar5 = eval(parser,node->lhs);
        uVar3 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(long)(int)(uint)(uVar5 < uVar3);
      }
      break;
    case ND_LE:
      if ((node->lhs->ty->is_unsigned & 1U) == 0) {
        iVar6 = eval(parser,node->lhs);
        iVar4 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(long)(int)(uint)(iVar6 <= iVar4);
      }
      else {
        uVar5 = eval(parser,node->lhs);
        uVar3 = eval(parser,node->rhs);
        parser_local = (C_Parser *)(long)(int)(uint)(uVar5 <= uVar3);
      }
      break;
    default:
      C_error_tok(parser,node->tok,"not a compile-time constant");
    case ND_COND:
      iVar6 = eval(parser,node->cond);
      if (iVar6 == 0) {
        local_d8 = (C_Parser *)eval2(parser,node->els,label);
      }
      else {
        local_d8 = (C_Parser *)eval2(parser,node->then,label);
      }
      parser_local = local_d8;
      break;
    case ND_COMMA:
      parser_local = (C_Parser *)eval2(parser,node->rhs,label);
      break;
    case ND_MEMBER:
      if (label == (char ***)0x0) {
        C_error_tok(parser,node->tok,"not a compile-time constant");
      }
      if (node->ty->kind != TY_ARRAY) {
        C_error_tok(parser,node->tok,"invalid initializer");
      }
      iVar6 = eval_rval(parser,node->lhs,label);
      parser_local = (C_Parser *)(iVar6 + node->member->offset);
      break;
    case ND_ADDR:
      parser_local = (C_Parser *)eval_rval(parser,node->lhs,label);
      break;
    case ND_NOT:
      iVar6 = eval(parser,node->lhs);
      parser_local = (C_Parser *)(long)(int)(uint)((iVar6 != 0 ^ 0xffU) & 1);
      break;
    case ND_BITNOT:
      uVar5 = eval(parser,node->lhs);
      parser_local = (C_Parser *)(uVar5 ^ 0xffffffffffffffff);
      break;
    case ND_LOGAND:
      iVar6 = eval(parser,node->lhs);
      local_d9 = false;
      if (iVar6 != 0) {
        iVar6 = eval(parser,node->rhs);
        local_d9 = iVar6 != 0;
      }
      parser_local = (C_Parser *)(long)(int)(uint)local_d9;
      break;
    case ND_LOGOR:
      iVar6 = eval(parser,node->lhs);
      local_da = true;
      if (iVar6 == 0) {
        iVar6 = eval(parser,node->rhs);
        local_da = iVar6 != 0;
      }
      parser_local = (C_Parser *)(long)(int)(uint)local_da;
      break;
    case ND_LABEL_VAL:
      *label = &node->unique_label;
      parser_local = (C_Parser *)0x0;
      break;
    case ND_VAR:
      if (label == (char ***)0x0) {
        C_error_tok(parser,node->tok,"not a compile-time constant");
      }
      if ((node->var->ty->kind != TY_ARRAY) && (node->var->ty->kind != TY_FUNC)) {
        C_error_tok(parser,node->tok,"invalid initializer");
      }
      *label = &node->var->name;
      parser_local = (C_Parser *)0x0;
      break;
    case ND_NUM:
      parser_local = (C_Parser *)node->val;
      break;
    case ND_CAST:
      parser_local = (C_Parser *)eval2(parser,node->lhs,label);
      _Var2 = C_is_integer(node->ty);
      if (_Var2) {
        iVar1 = node->ty->size;
        if (iVar1 == 1) {
          if ((node->ty->is_unsigned & 1U) == 0) {
            local_e4 = (uint)(char)parser_local;
          }
          else {
            local_e4 = (uint)parser_local & 0xff;
          }
          parser_local = (C_Parser *)(long)(int)local_e4;
        }
        else if (iVar1 == 2) {
          if ((node->ty->is_unsigned & 1U) == 0) {
            local_e8 = (uint)(short)parser_local;
          }
          else {
            local_e8 = (uint)parser_local & 0xffff;
          }
          parser_local = (C_Parser *)(long)(int)local_e8;
        }
        else if (iVar1 == 4) {
          parser_local = (C_Parser *)((ulong)parser_local & 0xffffffff);
        }
      }
    }
  }
  return (int64_t)parser_local;
}

Assistant:

static int64_t eval2(C_Parser *parser, C_Node *node, char ***label) {
  C_add_type(parser, node);

  if (C_is_flonum(node->ty))
    return eval_double(parser, node);

  switch (node->kind) {
  case ND_ADD:
    return eval2(parser, node->lhs, label) + eval(parser, node->rhs);
  case ND_SUB:
    return eval2(parser, node->lhs, label) - eval(parser, node->rhs);
  case ND_MUL:
    return eval(parser, node->lhs) * eval(parser, node->rhs);
  case ND_DIV:
    if (node->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) / eval(parser, node->rhs);
    return eval(parser, node->lhs) / eval(parser, node->rhs);
  case ND_NEG:
    return -eval(parser, node->lhs);
  case ND_MOD:
    if (node->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) % eval(parser, node->rhs);
    return eval(parser, node->lhs) % eval(parser, node->rhs);
  case ND_BITAND:
    return eval(parser, node->lhs) & eval(parser, node->rhs);
  case ND_BITOR:
    return eval(parser, node->lhs) | eval(parser, node->rhs);
  case ND_BITXOR:
    return eval(parser, node->lhs) ^ eval(parser, node->rhs);
  case ND_SHL:
    return eval(parser, node->lhs) << eval(parser, node->rhs);
  case ND_SHR:
    if (node->ty->is_unsigned && node->ty->size == 8)
      return (uint64_t)eval(parser, node->lhs) >> eval(parser, node->rhs);
    return eval(parser, node->lhs) >> eval(parser, node->rhs);
  case ND_EQ:
    return eval(parser, node->lhs) == eval(parser, node->rhs);
  case ND_NE:
    return eval(parser, node->lhs) != eval(parser, node->rhs);
  case ND_LT:
    if (node->lhs->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) < eval(parser, node->rhs);
    return eval(parser, node->lhs) < eval(parser, node->rhs);
  case ND_LE:
    if (node->lhs->ty->is_unsigned)
      return (uint64_t)eval(parser, node->lhs) <= eval(parser, node->rhs);
    return eval(parser, node->lhs) <= eval(parser, node->rhs);
  case ND_COND:
    return eval(parser, node->cond) ? eval2(parser, node->then, label) : eval2(parser, node->els, label);
  case ND_COMMA:
    return eval2(parser, node->rhs, label);
  case ND_NOT:
    return !eval(parser, node->lhs);
  case ND_BITNOT:
    return ~eval(parser, node->lhs);
  case ND_LOGAND:
    return eval(parser, node->lhs) && eval(parser, node->rhs);
  case ND_LOGOR:
    return eval(parser, node->lhs) || eval(parser, node->rhs);
  case ND_CAST: {
    int64_t val = eval2(parser, node->lhs, label);
    if (C_is_integer(node->ty)) {
      switch (node->ty->size) {
      case 1: return node->ty->is_unsigned ? (uint8_t)val : (int8_t)val;
      case 2: return node->ty->is_unsigned ? (uint16_t)val : (int16_t)val;
      case 4: return node->ty->is_unsigned ? (uint32_t)val : (int32_t)val;
      }
    }
    return val;
  }
  case ND_ADDR:
    return eval_rval(parser, node->lhs, label);
  case ND_LABEL_VAL:
    *label = &node->unique_label;
    return 0;
  case ND_MEMBER:
    if (!label)
      C_error_tok(parser, node->tok, "not a compile-time constant");
    if (node->ty->kind != TY_ARRAY)
      C_error_tok(parser, node->tok, "invalid initializer");
    return eval_rval(parser, node->lhs, label) + node->member->offset;
  case ND_VAR:
    if (!label)
      C_error_tok(parser, node->tok, "not a compile-time constant");
    if (node->var->ty->kind != TY_ARRAY && node->var->ty->kind != TY_FUNC)
      C_error_tok(parser, node->tok, "invalid initializer");
    *label = &node->var->name;
    return 0;
  case ND_NUM:
    return node->val;
  default:
    break;
  }

  C_error_tok(parser, node->tok, "not a compile-time constant");
  return 0; // not reached
}